

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O3

vector<sfc::Tile,_std::allocator<sfc::Tile>_> * __thiscall
sfc::Tileset::remap_tiles_for_input
          (vector<sfc::Tile,_std::allocator<sfc::Tile>_> *__return_storage_ptr__,Tileset *this,
          vector<sfc::Tile,_std::allocator<sfc::Tile>_> *tiles,Mode mode)

{
  pointer pTVar1;
  ulong uVar2;
  ulong uVar3;
  runtime_error *this_00;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> metatile;
  uint local_e4;
  ulong local_d8;
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> local_b8;
  Tileset *local_98;
  ulong local_90;
  Tile local_88;
  
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (mode == snes) {
    local_e4 = this->_tile_width;
    uVar7 = this->_tile_height;
    if (uVar7 == 0x10 || local_e4 == 0x10) {
LAB_00154a83:
      if ((this->_tiles).super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->_tiles).super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_90 = (ulong)(local_e4 >> 3);
        local_d8 = 0;
        local_98 = this;
        do {
          local_b8.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (uVar7 < 8) {
            uVar3 = 0;
          }
          else {
            uVar4 = 0;
            do {
              if (7 < local_e4) {
                uVar5 = (uVar4 << ((mode == snes) << 2)) + (int)local_d8;
                uVar3 = local_90;
                do {
                  uVar6 = (ulong)uVar5;
                  pTVar1 = (tiles->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  uVar2 = ((long)(tiles->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) *
                          0x2e8ba2e8ba2e8ba3;
                  if (uVar6 <= uVar2 && uVar2 - uVar6 != 0) {
                    std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::push_back
                              (&local_b8,pTVar1 + uVar6);
                  }
                  uVar5 = uVar5 + 1;
                  uVar3 = uVar3 - 1;
                } while (uVar3 != 0);
              }
              uVar4 = uVar4 + 1;
            } while (uVar4 != uVar7 >> 3);
            uVar3 = ((long)local_b8.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_b8.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
            this = local_98;
          }
          if (uVar3 == (uVar7 >> 3) * (local_e4 >> 3)) {
            Tile::Tile(&local_88,&local_b8,this->_no_flip,this->_tile_width,this->_tile_height);
            std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::emplace_back<sfc::Tile>
                      (__return_storage_ptr__,&local_88);
            if (local_88._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_88._palette.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_88._palette.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_88._palette.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector(&local_88._mirrors);
            if (local_88._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_88._data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_88._data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_88._data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::~vector(&local_b8);
          local_d8 = (ulong)((int)local_d8 + 1);
          uVar3 = ((long)(this->_tiles).super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_tiles).super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
        } while (local_d8 <= uVar3 && uVar3 - local_d8 != 0);
      }
      return __return_storage_ptr__;
    }
  }
  else if ((mode - gb < 2) && (this->_tile_height == 0x10)) {
    local_e4 = this->_tile_width;
    uVar7 = 0x10;
    goto LAB_00154a83;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"programmer error (remap_tiles_for_input invoked erroneously invoked)");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<Tile> Tileset::remap_tiles_for_input(const std::vector<Tile>& tiles, Mode mode) const {
  std::vector<Tile> tv;

  if ((mode == Mode::snes && (_tile_width == 16 || _tile_height == 16))
      || ( (mode == Mode::gb || mode == Mode::gbc) && _tile_height == 16)) {
    const unsigned cells_per_tile_h = _tile_width / 8;
    const unsigned cells_per_tile_v = _tile_height / 8;

    for (unsigned i = 0; i < _tiles.size(); ++i) {
      std::vector<Tile> metatile;
      for (unsigned yo = 0; yo < cells_per_tile_v; ++yo) {
        for (unsigned xo = 0; xo < cells_per_tile_h; ++xo) {
          if ((i + (yo * (mode == Mode::snes ? 16:1)) + xo) < tiles.size())
            metatile.push_back(tiles[i + (yo * (mode == Mode::snes ? 16:1)) + xo]);
        }
      }
      if (metatile.size() == cells_per_tile_h * cells_per_tile_v)
        tv.push_back(Tile(metatile, _no_flip, _tile_width, _tile_height));
    }

  } else {
    throw std::runtime_error("programmer error (remap_tiles_for_input invoked erroneously invoked)");
  }

  return tv;
}